

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O2

void __thiscall
xmrig::Workers<xmrig::OclLaunchData>::start
          (Workers<xmrig::OclLaunchData> *this,
          vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *data)

{
  pointer pOVar1;
  pointer ppTVar2;
  Thread<xmrig::OclLaunchData> *this_00;
  Hashrate *this_01;
  pointer config;
  pointer ppTVar3;
  Thread<xmrig::OclLaunchData> *local_30;
  
  pOVar1 = (data->super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (config = (data->
                super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>).
                _M_impl.super__Vector_impl_data._M_start; config != pOVar1; config = config + 1) {
    this_00 = (Thread<xmrig::OclLaunchData> *)operator_new(0x100);
    Thread<xmrig::OclLaunchData>::Thread
              (this_00,this->d_ptr->backend,
               (long)(this->m_workers).
                     super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_workers).
                     super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,config);
    local_30 = this_00;
    std::
    vector<xmrig::Thread<xmrig::OclLaunchData>*,std::allocator<xmrig::Thread<xmrig::OclLaunchData>*>>
    ::emplace_back<xmrig::Thread<xmrig::OclLaunchData>*>
              ((vector<xmrig::Thread<xmrig::OclLaunchData>*,std::allocator<xmrig::Thread<xmrig::OclLaunchData>*>>
                *)this,&local_30);
  }
  this_01 = (Hashrate *)operator_new(0x20);
  Hashrate::Hashrate(this_01,(long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_workers).
                                   super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  this->d_ptr->hashrate = this_01;
  LOCK();
  DAT_001bde58 = DAT_001bde58 + 1;
  UNLOCK();
  ppTVar2 = (this->m_workers).
            super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->m_workers).
                 super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar2;
      ppTVar3 = ppTVar3 + 1) {
    Thread<xmrig::OclLaunchData>::start(*ppTVar3,onReady);
  }
  return;
}

Assistant:

void xmrig::Workers<T>::start(const std::vector<T> &data)
{
    for (const T &item : data) {
        m_workers.push_back(new Thread<T>(d_ptr->backend, m_workers.size(), item));
    }

    d_ptr->hashrate = new Hashrate(m_workers.size());
    Nonce::touch(T::backend());

    for (Thread<T> *worker : m_workers) {
        worker->start(Workers<T>::onReady);
    }
}